

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall AssignmentNode::~AssignmentNode(AssignmentNode *this)

{
  AssignmentNode *in_RDI;
  
  ~AssignmentNode(in_RDI);
  operator_delete(in_RDI,0x48);
  return;
}

Assistant:

AssignmentNode(const std::string& name, 
    const AssignmentOperator& operation, std::unique_ptr<ExpressionNode> value):
      name_(name), operator_(operation), value_(std::move(value)) {}